

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O2

void XCryptionCommon::append(ByteList *ioTargetList,ByteList *inSource)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)inSource;
  while (p_Var1 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)inSource) {
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (ioTargetList,(value_type_conflict3 *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void XCryptionCommon::append(ByteList& ioTargetList, const ByteList& inSource) {
	ByteList::const_iterator it = inSource.begin();

	for (; it != inSource.end(); ++it)
		ioTargetList.push_back(*it);
}